

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O0

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  int local_1c;
  int32 i;
  mfcc_t *vec_local;
  cmn_t *cmn_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x37,"Update from < ");
  for (local_1c = 0; local_1c < cmn->veclen; local_1c = local_1c + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[local_1c]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  for (local_1c = 0; local_1c < cmn->veclen; local_1c = local_1c + 1) {
    cmn->cmn_mean[local_1c] = vec[local_1c];
    cmn->sum[local_1c] = (mfcc_t)((float)vec[local_1c] * 500.0);
  }
  cmn->nframe = 500;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x42,"Update to   < ");
  for (local_1c = 0; local_1c < cmn->veclen; local_1c = local_1c + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[local_1c]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}